

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

void av1_update_mv_stats(MV *mv,MV *ref,nmv_context *mvctx,MvSubpelPrecision precision)

{
  MV_JOINT_TYPE type;
  int iVar1;
  aom_cdf_prob *in_RDX;
  short *in_RSI;
  short *in_RDI;
  MV_JOINT_TYPE j;
  MV diff;
  nmv_component *in_stack_00000028;
  int in_stack_00000034;
  MV local_1e;
  aom_cdf_prob *local_18;
  
  local_1e.row = *in_RDI - *in_RSI;
  local_1e.col = in_RDI[1] - in_RSI[1];
  local_18 = in_RDX;
  type = av1_get_mv_joint(&local_1e);
  update_cdf(local_18,type,4);
  iVar1 = mv_joint_vertical(type);
  if (iVar1 != 0) {
    update_mv_component_stats(in_stack_00000034,in_stack_00000028,mv._7_1_);
  }
  iVar1 = mv_joint_horizontal(type);
  if (iVar1 != 0) {
    update_mv_component_stats(in_stack_00000034,in_stack_00000028,mv._7_1_);
  }
  return;
}

Assistant:

void av1_update_mv_stats(const MV *mv, const MV *ref, nmv_context *mvctx,
                         MvSubpelPrecision precision) {
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);

  update_cdf(mvctx->joints_cdf, j, MV_JOINTS);

  if (mv_joint_vertical(j))
    update_mv_component_stats(diff.row, &mvctx->comps[0], precision);

  if (mv_joint_horizontal(j))
    update_mv_component_stats(diff.col, &mvctx->comps[1], precision);
}